

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_netstd_generator.cc
# Opt level: O0

void __thiscall
t_netstd_generator::generate_deserialize_container
          (t_netstd_generator *this,ostream *out,t_type *ttype,string *prefix)

{
  string *psVar1;
  t_type *ptVar2;
  byte bVar3;
  ostream *poVar4;
  string local_378;
  string local_358;
  string local_338;
  string local_318;
  string local_2f8;
  string local_2d8;
  string local_2b8;
  string local_298;
  string local_278;
  string local_258;
  allocator local_231;
  string local_230;
  undefined1 local_210 [8];
  string i;
  string local_1d0;
  string local_1b0;
  string local_190;
  string local_170;
  allocator local_149;
  string local_148;
  string local_128;
  allocator local_101;
  string local_100;
  string local_e0;
  allocator local_b9;
  string local_b8;
  string local_98;
  string local_78 [8];
  string obj;
  string local_48;
  string *local_28;
  string *prefix_local;
  t_type *ttype_local;
  ostream *out_local;
  t_netstd_generator *this_local;
  
  local_28 = prefix;
  prefix_local = (string *)ttype;
  ttype_local = (t_type *)out;
  out_local = (ostream *)this;
  t_generator::indent_abi_cxx11_(&local_48,(t_generator *)this);
  poVar4 = std::operator<<(out,(string *)&local_48);
  poVar4 = std::operator<<(poVar4,"{");
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_48);
  t_generator::indent_up((t_generator *)this);
  std::__cxx11::string::string(local_78);
  bVar3 = (**(code **)(*(long *)prefix_local + 0x80))();
  if ((bVar3 & 1) == 0) {
    bVar3 = (**(code **)(*(long *)prefix_local + 0x78))();
    if ((bVar3 & 1) == 0) {
      bVar3 = (**(code **)(*(long *)prefix_local + 0x70))();
      if ((bVar3 & 1) != 0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_148,"_list",&local_149);
        t_generator::tmp(&local_128,(t_generator *)this,&local_148);
        std::__cxx11::string::operator=(local_78,(string *)&local_128);
        std::__cxx11::string::~string((string *)&local_128);
        std::__cxx11::string::~string((string *)&local_148);
        std::allocator<char>::~allocator((allocator<char> *)&local_149);
      }
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_100,"_set",&local_101);
      t_generator::tmp(&local_e0,(t_generator *)this,&local_100);
      std::__cxx11::string::operator=(local_78,(string *)&local_e0);
      std::__cxx11::string::~string((string *)&local_e0);
      std::__cxx11::string::~string((string *)&local_100);
      std::allocator<char>::~allocator((allocator<char> *)&local_101);
    }
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_b8,"_map",&local_b9);
    t_generator::tmp(&local_98,(t_generator *)this,&local_b8);
    std::__cxx11::string::operator=(local_78,(string *)&local_98);
    std::__cxx11::string::~string((string *)&local_98);
    std::__cxx11::string::~string((string *)&local_b8);
    std::allocator<char>::~allocator((allocator<char> *)&local_b9);
  }
  bVar3 = (**(code **)(*(long *)prefix_local + 0x80))();
  ptVar2 = ttype_local;
  if ((bVar3 & 1) == 0) {
    bVar3 = (**(code **)(*(long *)prefix_local + 0x78))();
    ptVar2 = ttype_local;
    if ((bVar3 & 1) == 0) {
      bVar3 = (**(code **)(*(long *)prefix_local + 0x70))();
      ptVar2 = ttype_local;
      if ((bVar3 & 1) != 0) {
        t_generator::indent_abi_cxx11_(&local_1b0,(t_generator *)this);
        poVar4 = std::operator<<((ostream *)ptVar2,(string *)&local_1b0);
        poVar4 = std::operator<<(poVar4,"TList ");
        poVar4 = std::operator<<(poVar4,local_78);
        poVar4 = std::operator<<(poVar4," = await iprot.ReadListBeginAsync(");
        poVar4 = std::operator<<(poVar4,(string *)&CANCELLATION_TOKEN_NAME_abi_cxx11_);
        poVar4 = std::operator<<(poVar4,");");
        std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
        std::__cxx11::string::~string((string *)&local_1b0);
      }
    }
    else {
      t_generator::indent_abi_cxx11_(&local_190,(t_generator *)this);
      poVar4 = std::operator<<((ostream *)ptVar2,(string *)&local_190);
      poVar4 = std::operator<<(poVar4,"TSet ");
      poVar4 = std::operator<<(poVar4,local_78);
      poVar4 = std::operator<<(poVar4," = await iprot.ReadSetBeginAsync(");
      poVar4 = std::operator<<(poVar4,(string *)&CANCELLATION_TOKEN_NAME_abi_cxx11_);
      poVar4 = std::operator<<(poVar4,");");
      std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
      std::__cxx11::string::~string((string *)&local_190);
    }
  }
  else {
    t_generator::indent_abi_cxx11_(&local_170,(t_generator *)this);
    poVar4 = std::operator<<((ostream *)ptVar2,(string *)&local_170);
    poVar4 = std::operator<<(poVar4,"TMap ");
    poVar4 = std::operator<<(poVar4,local_78);
    poVar4 = std::operator<<(poVar4," = await iprot.ReadMapBeginAsync(");
    poVar4 = std::operator<<(poVar4,(string *)&CANCELLATION_TOKEN_NAME_abi_cxx11_);
    poVar4 = std::operator<<(poVar4,");");
    std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_170);
  }
  ptVar2 = ttype_local;
  t_generator::indent_abi_cxx11_(&local_1d0,(t_generator *)this);
  poVar4 = std::operator<<((ostream *)ptVar2,(string *)&local_1d0);
  poVar4 = std::operator<<(poVar4,(string *)prefix);
  poVar4 = std::operator<<(poVar4," = new ");
  type_name_abi_cxx11_((string *)((long)&i.field_2 + 8),this,(t_type *)prefix_local,true);
  poVar4 = std::operator<<(poVar4,(string *)(i.field_2._M_local_buf + 8));
  poVar4 = std::operator<<(poVar4,"(");
  poVar4 = std::operator<<(poVar4,local_78);
  poVar4 = std::operator<<(poVar4,".Count);");
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)(i.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)&local_1d0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_230,"_i",&local_231);
  t_generator::tmp((string *)local_210,(t_generator *)this,&local_230);
  std::__cxx11::string::~string((string *)&local_230);
  std::allocator<char>::~allocator((allocator<char> *)&local_231);
  ptVar2 = ttype_local;
  t_generator::indent_abi_cxx11_(&local_258,(t_generator *)this);
  poVar4 = std::operator<<((ostream *)ptVar2,(string *)&local_258);
  poVar4 = std::operator<<(poVar4,"for(int ");
  poVar4 = std::operator<<(poVar4,(string *)local_210);
  poVar4 = std::operator<<(poVar4," = 0; ");
  poVar4 = std::operator<<(poVar4,(string *)local_210);
  poVar4 = std::operator<<(poVar4," < ");
  poVar4 = std::operator<<(poVar4,local_78);
  poVar4 = std::operator<<(poVar4,".Count; ++");
  poVar4 = std::operator<<(poVar4,(string *)local_210);
  poVar4 = std::operator<<(poVar4,")");
  poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&local_278,(t_generator *)this);
  poVar4 = std::operator<<(poVar4,(string *)&local_278);
  poVar4 = std::operator<<(poVar4,"{");
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_278);
  std::__cxx11::string::~string((string *)&local_258);
  t_generator::indent_up((t_generator *)this);
  bVar3 = (**(code **)(*(long *)prefix_local + 0x80))();
  ptVar2 = ttype_local;
  psVar1 = prefix_local;
  if ((bVar3 & 1) == 0) {
    bVar3 = (**(code **)(*(long *)prefix_local + 0x78))();
    ptVar2 = ttype_local;
    psVar1 = prefix_local;
    if ((bVar3 & 1) == 0) {
      bVar3 = (**(code **)(*(long *)prefix_local + 0x70))();
      ptVar2 = ttype_local;
      psVar1 = prefix_local;
      if ((bVar3 & 1) != 0) {
        std::__cxx11::string::string((string *)&local_2d8,(string *)prefix);
        generate_deserialize_list_element(this,(ostream *)ptVar2,(t_list *)psVar1,&local_2d8);
        std::__cxx11::string::~string((string *)&local_2d8);
      }
    }
    else {
      std::__cxx11::string::string((string *)&local_2b8,(string *)prefix);
      generate_deserialize_set_element(this,(ostream *)ptVar2,(t_set *)psVar1,&local_2b8);
      std::__cxx11::string::~string((string *)&local_2b8);
    }
  }
  else {
    std::__cxx11::string::string((string *)&local_298,(string *)prefix);
    generate_deserialize_map_element(this,(ostream *)ptVar2,(t_map *)psVar1,&local_298);
    std::__cxx11::string::~string((string *)&local_298);
  }
  t_generator::indent_down((t_generator *)this);
  ptVar2 = ttype_local;
  t_generator::indent_abi_cxx11_(&local_2f8,(t_generator *)this);
  poVar4 = std::operator<<((ostream *)ptVar2,(string *)&local_2f8);
  poVar4 = std::operator<<(poVar4,"}");
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_2f8);
  bVar3 = (**(code **)(*(long *)prefix_local + 0x80))();
  ptVar2 = ttype_local;
  if ((bVar3 & 1) == 0) {
    bVar3 = (**(code **)(*(long *)prefix_local + 0x78))();
    ptVar2 = ttype_local;
    if ((bVar3 & 1) == 0) {
      bVar3 = (**(code **)(*(long *)prefix_local + 0x70))();
      ptVar2 = ttype_local;
      if ((bVar3 & 1) != 0) {
        t_generator::indent_abi_cxx11_(&local_358,(t_generator *)this);
        poVar4 = std::operator<<((ostream *)ptVar2,(string *)&local_358);
        poVar4 = std::operator<<(poVar4,"await iprot.ReadListEndAsync(");
        poVar4 = std::operator<<(poVar4,(string *)&CANCELLATION_TOKEN_NAME_abi_cxx11_);
        poVar4 = std::operator<<(poVar4,");");
        std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
        std::__cxx11::string::~string((string *)&local_358);
      }
    }
    else {
      t_generator::indent_abi_cxx11_(&local_338,(t_generator *)this);
      poVar4 = std::operator<<((ostream *)ptVar2,(string *)&local_338);
      poVar4 = std::operator<<(poVar4,"await iprot.ReadSetEndAsync(");
      poVar4 = std::operator<<(poVar4,(string *)&CANCELLATION_TOKEN_NAME_abi_cxx11_);
      poVar4 = std::operator<<(poVar4,");");
      std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
      std::__cxx11::string::~string((string *)&local_338);
    }
  }
  else {
    t_generator::indent_abi_cxx11_(&local_318,(t_generator *)this);
    poVar4 = std::operator<<((ostream *)ptVar2,(string *)&local_318);
    poVar4 = std::operator<<(poVar4,"await iprot.ReadMapEndAsync(");
    poVar4 = std::operator<<(poVar4,(string *)&CANCELLATION_TOKEN_NAME_abi_cxx11_);
    poVar4 = std::operator<<(poVar4,");");
    std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_318);
  }
  t_generator::indent_down((t_generator *)this);
  ptVar2 = ttype_local;
  t_generator::indent_abi_cxx11_(&local_378,(t_generator *)this);
  poVar4 = std::operator<<((ostream *)ptVar2,(string *)&local_378);
  poVar4 = std::operator<<(poVar4,"}");
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_378);
  std::__cxx11::string::~string((string *)local_210);
  std::__cxx11::string::~string(local_78);
  return;
}

Assistant:

void t_netstd_generator::generate_deserialize_container(ostream& out, t_type* ttype, string prefix)
{
    out << indent() << "{" << endl;
    indent_up();

    string obj;

    if (ttype->is_map())
    {
        obj = tmp("_map");
    }
    else if (ttype->is_set())
    {
        obj = tmp("_set");
    }
    else if (ttype->is_list())
    {
        obj = tmp("_list");
    }

    if (ttype->is_map())
    {
        out << indent() << "TMap " << obj << " = await iprot.ReadMapBeginAsync(" << CANCELLATION_TOKEN_NAME << ");" << endl;
    }
    else if (ttype->is_set())
    {
        out << indent() << "TSet " << obj << " = await iprot.ReadSetBeginAsync(" << CANCELLATION_TOKEN_NAME << ");" << endl;
    }
    else if (ttype->is_list())
    {
        out << indent() << "TList " << obj << " = await iprot.ReadListBeginAsync(" << CANCELLATION_TOKEN_NAME << ");" << endl;
    }

    out << indent() << prefix << " = new " << type_name(ttype) << "(" << obj << ".Count);" << endl;
    string i = tmp("_i");
    out << indent() << "for(int " << i << " = 0; " << i << " < " << obj << ".Count; ++" << i << ")" << endl
        << indent() << "{" << endl;
    indent_up();

    if (ttype->is_map())
    {
        generate_deserialize_map_element(out, static_cast<t_map*>(ttype), prefix);
    }
    else if (ttype->is_set())
    {
        generate_deserialize_set_element(out, static_cast<t_set*>(ttype), prefix);
    }
    else if (ttype->is_list())
    {
        generate_deserialize_list_element(out, static_cast<t_list*>(ttype), prefix);
    }

    indent_down();
    out << indent() << "}" << endl;

    if (ttype->is_map())
    {
        out << indent() << "await iprot.ReadMapEndAsync(" << CANCELLATION_TOKEN_NAME << ");" << endl;
    }
    else if (ttype->is_set())
    {
        out << indent() << "await iprot.ReadSetEndAsync(" << CANCELLATION_TOKEN_NAME << ");" << endl;
    }
    else if (ttype->is_list())
    {
        out << indent() << "await iprot.ReadListEndAsync(" << CANCELLATION_TOKEN_NAME << ");" << endl;
    }

    indent_down();
    out << indent() << "}" << endl;
}